

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall Div::assign(Div *this,string *var,Expression *expression)

{
  Expression *pEVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  Expression *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pEVar5 = (Expression *)operator_new(0x18);
  pEVar1 = this->left;
  local_70[0] = local_60;
  pcVar2 = (var->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + var->_M_string_length);
  iVar3 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_70,expression);
  pEVar1 = this->right;
  local_50[0] = local_40;
  pcVar2 = (var->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + var->_M_string_length);
  iVar4 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_50,expression);
  pEVar5->_vptr_Expression = (_func_int **)&PTR_calculate_0012a7c8;
  pEVar5[1]._vptr_Expression = (_func_int **)CONCAT44(extraout_var,iVar3);
  pEVar5[2]._vptr_Expression = (_func_int **)CONCAT44(extraout_var_00,iVar4);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return pEVar5;
}

Assistant:

Expression *Div::assign(string var, Expression *expression) {
    return new Div(left->assign(var, expression), right->assign(var, expression));
}